

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.cc
# Opt level: O1

void __thiscall
google::protobuf::io::Printer::Annotate
          (Printer *this,string_view begin_varname,string_view end_varname,string_view file_path,
          vector<int,_std::allocator<int>_> *path,
          optional<google::protobuf::io::AnnotationCollector::Semantic> semantic)

{
  AnnotationCollector *pAVar1;
  string_view v;
  LogMessage *this_00;
  string_view str;
  string_view v_00;
  string_view str_00;
  PrintOptions opts;
  PrintOptions opts_00;
  optional<std::pair<unsigned_long,_unsigned_long>_> end;
  optional<std::pair<unsigned_long,_unsigned_long>_> begin;
  LogMessage local_a0;
  long local_90 [2];
  char *local_80;
  size_t local_78;
  char *local_70;
  vector<int,_std::allocator<int>_> *local_68;
  optional<std::pair<unsigned_long,_unsigned_long>_> local_60;
  _Storage<std::pair<unsigned_long,_unsigned_long>,_true> local_48;
  char local_38;
  ulong uVar2;
  
  local_80 = begin_varname._M_str;
  v_00._M_len = begin_varname._M_len;
  if ((this->options_).annotation_collector != (AnnotationCollector *)0x0) {
    opts.use_annotation_frames = SUB81(path,0);
    opts.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
    _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)0x0;
    opts.checks_are_debug_only = true;
    opts.use_substitution_map = false;
    opts.use_curly_brace_substitutions = false;
    opts.allow_digit_substitutions = true;
    opts.strip_spaces_around_vars = true;
    opts.strip_raw_string_indentation = false;
    uVar2 = (ulong)path & 0xff;
    local_68 = path;
    GetSubstitutionRange
              ((optional<std::pair<unsigned_long,_unsigned_long>_> *)&local_48._M_value,this,
               begin_varname,opts);
    opts_00.use_annotation_frames = SUB81(uVar2,0);
    opts_00.loc.super__Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>.
    _M_payload.super__Optional_payload_base<google::protobuf::io::Printer::SourceLocation> =
         (_Optional_base<google::protobuf::io::Printer::SourceLocation,_true,_true>)0x0;
    opts_00.checks_are_debug_only = true;
    opts_00.use_substitution_map = false;
    opts_00.use_curly_brace_substitutions = false;
    opts_00.allow_digit_substitutions = true;
    opts_00.strip_spaces_around_vars = true;
    opts_00.strip_raw_string_indentation = false;
    local_78 = end_varname._M_len;
    local_70 = end_varname._M_str;
    GetSubstitutionRange(&local_60,this,end_varname,opts_00);
    if ((local_38 == '\x01') &&
       (local_60.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
        _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>._M_engaged
        == true)) {
      if (local_60.super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
          _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>.
          _M_payload._M_value.second < local_48._M_value.first) {
        absl::lts_20250127::log_internal::LogMessageDebugFatal::LogMessageDebugFatal
                  ((LogMessageDebugFatal *)&local_a0,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/io/printer.cc"
                   ,0x189);
        str._M_str = "annotation has negative length from ";
        str._M_len = 0x24;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (&local_a0,str);
        v_00._M_str = local_80;
        this_00 = absl::lts_20250127::log_internal::LogMessage::operator<<(&local_a0,v_00);
        str_00._M_str = " to ";
        str_00._M_len = 4;
        absl::lts_20250127::log_internal::LogMessage::
        CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>
                  (this_00,str_00);
        v._M_str = local_70;
        v._M_len = local_78;
        absl::lts_20250127::log_internal::LogMessage::operator<<(this_00,v);
        absl::lts_20250127::log_internal::LogMessageDebugFatal::~LogMessageDebugFatal
                  ((LogMessageDebugFatal *)&local_a0);
      }
      else {
        pAVar1 = (this->options_).annotation_collector;
        local_a0._0_8_ = local_90;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_a0,file_path._M_str,file_path._M_str + file_path._M_len);
        (*pAVar1->_vptr_AnnotationCollector[3])
                  (pAVar1,local_48._M_value.first,
                   local_60.
                   super__Optional_base<std::pair<unsigned_long,_unsigned_long>,_true,_true>.
                   _M_payload.super__Optional_payload_base<std::pair<unsigned_long,_unsigned_long>_>
                   ._M_payload._M_value.second,&local_a0,local_68,
                   semantic.
                   super__Optional_base<google::protobuf::io::AnnotationCollector::Semantic,_true,_true>
                   ._M_payload.
                   super__Optional_payload_base<google::protobuf::io::AnnotationCollector::Semantic>
                  );
        if ((long *)local_a0._0_8_ != local_90) {
          operator_delete((void *)local_a0._0_8_,local_90[0] + 1);
        }
      }
    }
  }
  return;
}

Assistant:

void Printer::Annotate(absl::string_view begin_varname,
                       absl::string_view end_varname,
                       absl::string_view file_path,
                       const std::vector<int>& path,
                       absl::optional<AnnotationCollector::Semantic> semantic) {
  if (options_.annotation_collector == nullptr) {
    return;
  }

  PrintOptions opts;
  opts.checks_are_debug_only = true;
  auto begin = GetSubstitutionRange(begin_varname, opts);
  auto end = GetSubstitutionRange(end_varname, opts);
  if (!begin.has_value() || !end.has_value()) {
    return;
  }
  if (begin->first > end->second) {
    ABSL_DLOG(FATAL) << "annotation has negative length from " << begin_varname
                     << " to " << end_varname;
    return;
  }
  options_.annotation_collector->AddAnnotation(
      begin->first, end->second, std::string(file_path), path, semantic);
}